

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

SchnorrKeyPairDataStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::TweakPrivkeyDataStruct,cfd::js::api::SchnorrKeyPairDataStruct>
          (SchnorrKeyPairDataStruct *__return_storage_ptr__,api *this,
          TweakPrivkeyDataStruct *request,
          function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  SchnorrKeyPairDataStruct local_130;
  undefined1 local_29;
  function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
  *call_function_local;
  TweakPrivkeyDataStruct *request_local;
  SchnorrKeyPairDataStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = &request->privkey;
  call_function_local =
       (function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
        *)this;
  request_local = (TweakPrivkeyDataStruct *)__return_storage_ptr__;
  SchnorrKeyPairDataStruct::SchnorrKeyPairDataStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>::
  operator()(&local_130,
             (function<cfd::js::api::SchnorrKeyPairDataStruct_(const_cfd::js::api::TweakPrivkeyDataStruct_&)>
              *)request,(TweakPrivkeyDataStruct *)call_function_local);
  SchnorrKeyPairDataStruct::operator=(__return_storage_ptr__,&local_130);
  SchnorrKeyPairDataStruct::~SchnorrKeyPairDataStruct(&local_130);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}